

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O2

void __thiscall Snes_Spc::reset(Snes_Spc *this)

{
  memset((this->m).ram.ram,0xff,0x10000);
  ram_loaded(this);
  reset_common(this,0xf);
  Spc_Dsp::reset(&this->dsp);
  return;
}

Assistant:

void Snes_Spc::reset()
{
	memset( RAM, 0xFF, 0x10000 );
	ram_loaded();
	reset_common( 0x0F );
	dsp.reset();
}